

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateFastCharAt
          (Lowerer *this,BuiltinFunction index,Opnd *dst,Opnd *srcStr,Opnd *srcIndex,
          Instr *callInstr,Instr *insertInstr,LabelInstr *labelHelper,LabelInstr *doneLabel)

{
  _func_int **pp_Var1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  PragmaInstr *instr;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar7;
  IntConstOpnd *pIVar8;
  Lowerer *pLVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  Lowerer *pLVar13;
  RegOpnd *local_38;
  
  pLVar13 = (Lowerer *)srcStr;
  OVar3 = IR::Opnd::GetKind(srcStr);
  if (OVar3 == OpndKindReg) {
    OVar3 = IR::Opnd::GetKind(srcStr);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_005d9a20;
      *puVar5 = 0;
    }
    pLVar13 = (Lowerer *)srcStr;
    bVar4 = IR::Opnd::IsTaggedInt(srcStr);
    if (bVar4) {
      pRVar6 = GetRegOpnd(pLVar13,srcStr,insertInstr,this->m_func,TyVar);
      instr = IR::PragmaInstr::New(DeletedNonHelperBranch,0,this->m_func);
      IR::Instr::InsertBefore(insertInstr,&instr->super_Instr);
      InsertBranch(Br,false,labelHelper,insertInstr);
    }
    else {
      OVar3 = IR::Opnd::GetKind(srcStr);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005d9a20;
        *puVar5 = 0;
      }
      pLVar13 = (Lowerer *)srcStr;
      bVar4 = IR::Opnd::IsNotTaggedValue(srcStr);
      pRVar6 = GetRegOpnd(pLVar13,srcStr,insertInstr,this->m_func,TyVar);
      if (!bVar4) goto LAB_005d90a1;
    }
  }
  else {
    pRVar6 = GetRegOpnd(pLVar13,srcStr,insertInstr,this->m_func,TyVar);
LAB_005d90a1:
    LowererMD::GenerateObjectTest
              (&this->m_lowererMD,&pRVar6->super_Opnd,insertInstr,labelHelper,false);
  }
  OVar3 = IR::Opnd::GetKind(srcIndex);
  if (OVar3 == OpndKindAddr) {
    OVar3 = IR::Opnd::GetKind(srcIndex);
    if (OVar3 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar4) goto LAB_005d9a20;
      *puVar5 = 0;
    }
    pp_Var1 = srcIndex[2]._vptr_Opnd;
    if (((ulong)pp_Var1 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pp_Var1 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pp_Var1 & 0xffff000000000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        pcVar11 = "(Is(aValue))";
        pcVar10 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x43;
        goto LAB_005d928c;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      pcVar11 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar10 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_005d928c:
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                         ,uVar12,pcVar11,pcVar10);
      if (!bVar4) goto LAB_005d9a20;
      *puVar5 = 0;
    }
    if ((int)pp_Var1 < 0) {
      labelHelper->field_0x78 = labelHelper->field_0x78 & 0xfd;
      InsertBranch(Br,false,labelHelper,insertInstr);
      return false;
    }
  }
  GenerateStringTest(this,pRVar6,insertInstr,labelHelper,(LabelInstr *)0x0,false);
  baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  OVar3 = IR::Opnd::GetKind(&pRVar6->super_Opnd);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_005d9a20;
    *puVar5 = 0;
  }
  pIVar7 = IR::IndirOpnd::New(pRVar6,0x10,TyUint64,this->m_func,false);
  InsertMove(&baseOpnd->super_Opnd,&pIVar7->super_Opnd,insertInstr,true);
  InsertTest(&baseOpnd->super_Opnd,&baseOpnd->super_Opnd,insertInstr);
  InsertBranch(BrEq_A,false,labelHelper,insertInstr);
  local_38 = IR::RegOpnd::New(TyUint32,this->m_func);
  pIVar7 = IR::IndirOpnd::New(pRVar6,0x18,TyUint32,this->m_func,false);
  InsertMove(&local_38->super_Opnd,&pIVar7->super_Opnd,insertInstr,true);
  OVar3 = IR::Opnd::GetKind(srcIndex);
  if (OVar3 == OpndKindAddr) {
    OVar3 = IR::Opnd::GetKind(srcIndex);
    if (OVar3 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar4) goto LAB_005d9a20;
      *puVar5 = 0;
    }
    pp_Var1 = srcIndex[2]._vptr_Opnd;
    if (((ulong)pp_Var1 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pp_Var1 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pp_Var1 & 0xffff000000000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        pcVar11 = "(Is(aValue))";
        pcVar10 = "Ensure var is actually a \'TaggedInt\'";
        uVar12 = 0x51;
        goto LAB_005d9635;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      pcVar11 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar10 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar12 = 0x2a;
LAB_005d9635:
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                         ,uVar12,pcVar11,pcVar10);
      if (!bVar4) goto LAB_005d9a20;
      *puVar5 = 0;
    }
    pLVar9 = (Lowerer *)((ulong)pp_Var1 & 0xffffffff);
    pLVar13 = pLVar9;
    pIVar8 = IR::IntConstOpnd::New((IntConstType)pLVar9,TyUint32,this->m_func,false);
    InsertCompareBranch(pLVar13,&local_38->super_Opnd,&pIVar8->super_Opnd,BrLe_A,true,labelHelper,
                        insertInstr,false);
    pIVar7 = IR::IndirOpnd::New(baseOpnd,(int)pp_Var1 * 2,TyUint16,this->m_func,false);
    pIVar8 = IR::IntConstOpnd::New((IntConstType)pLVar9,TyUint64,this->m_func,false);
  }
  else {
    pRVar6 = IR::RegOpnd::New(TyVar,this->m_func);
    InsertMove(&pRVar6->super_Opnd,srcIndex,insertInstr,true);
    pLVar13 = this;
    pIVar8 = (IntConstOpnd *)GenerateUntagVar(this,pRVar6,labelHelper,insertInstr,true);
    InsertCompareBranch(pLVar13,&local_38->super_Opnd,(Opnd *)pIVar8,BrLe_A,true,labelHelper,
                        insertInstr,false);
    if (TySize[(pIVar8->super_Opnd).m_type] != 8) {
      pIVar8 = (IntConstOpnd *)IR::Opnd::UseWithNewType((Opnd *)pIVar8,TyUint64,this->m_func);
      OVar3 = IR::Opnd::GetKind((Opnd *)pIVar8);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005d9a20;
        *puVar5 = 0;
      }
    }
    pIVar7 = IR::IndirOpnd::New(baseOpnd,(RegOpnd *)pIVar8,'\x01',TyUint16,this->m_func);
  }
  if (DAT_015a4dbf == '\x01') {
    pRVar6 = IR::RegOpnd::New(TyUint64,this->m_func);
    if (TySize[(local_38->super_Opnd).m_type] != 8) {
      local_38 = (RegOpnd *)IR::Opnd::UseWithNewType(&local_38->super_Opnd,TyUint64,this->m_func);
      OVar3 = IR::Opnd::GetKind((Opnd *)local_38);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005d9a20;
        *puVar5 = 0;
      }
    }
    InsertSub(false,&pRVar6->super_Opnd,&pIVar8->super_Opnd,&local_38->super_Opnd,insertInstr);
    pIVar8 = IR::IntConstOpnd::New(0x3f,TyInt8,this->m_func,false);
    InsertShift(Shr_A,false,&pRVar6->super_Opnd,&pRVar6->super_Opnd,&pIVar8->super_Opnd,insertInstr)
    ;
    if (TySize[(pRVar6->super_Opnd).m_type] != 7) {
      pRVar6 = (RegOpnd *)IR::Opnd::UseWithNewType(&pRVar6->super_Opnd,TyUint32,this->m_func);
      OVar3 = IR::Opnd::GetKind((Opnd *)pRVar6);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005d9a20;
        *puVar5 = 0;
      }
    }
  }
  else {
    pRVar6 = (RegOpnd *)0x0;
  }
  pLVar9 = (Lowerer *)IR::RegOpnd::New(TyUint32,this->m_func);
  pLVar13 = pLVar9;
  InsertMove((Opnd *)pLVar9,&pIVar7->super_Opnd,insertInstr,true);
  if (DAT_015a4dbf == '\x01') {
    pLVar13 = pLVar9;
    InsertAnd((Opnd *)pLVar9,(Opnd *)pLVar9,&pRVar6->super_Opnd,insertInstr);
  }
  if (index._value == '\a') {
    GenerateFastInlineStringCodePointAt
              (pLVar13,insertInstr,this->m_func,&local_38->super_Opnd,srcIndex,(RegOpnd *)pLVar9,
               baseOpnd);
  }
  else if (index._value != '\t') {
    if (index._value == '\b') {
      bVar4 = IR::Opnd::IsEqual(dst,srcStr);
      if (bVar4) {
        dst = &IR::RegOpnd::New(TyVar,this->m_func)->super_Opnd;
      }
      GenerateGetSingleCharString
                (this,(RegOpnd *)pLVar9,dst,labelHelper,doneLabel,insertInstr,false);
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5476,
                       "(index == Js::BuiltinFunction::JavascriptString_CharCodeAt || index == Js::BuiltinFunction::JavascriptString_CodePointAt)"
                       ,
                       "index == Js::BuiltinFunction::JavascriptString_CharCodeAt || index == Js::BuiltinFunction::JavascriptString_CodePointAt"
                      );
    if (!bVar4) goto LAB_005d9a20;
    *puVar5 = 0;
  }
  if (TySize[*(byte *)((anon_union_2_4_ea848c7b_for_ValueType_13 *)
                       &(pLVar9->m_lowererMD).FloatPrefThreshold + 1)] != 8) {
    pLVar9 = (Lowerer *)IR::Opnd::UseWithNewType((Opnd *)pLVar9,TyUint64,this->m_func);
    OVar3 = IR::Opnd::GetKind((Opnd *)pLVar9);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) {
LAB_005d9a20:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  LowererMD::GenerateInt32ToVarConversion(&this->m_lowererMD,(Opnd *)pLVar9,insertInstr);
  InsertMove(dst,(Opnd *)pLVar9,insertInstr,true);
  return true;
}

Assistant:

bool
Lowerer::GenerateFastCharAt(Js::BuiltinFunction index, IR::Opnd *dst, IR::Opnd *srcStr, IR::Opnd *srcIndex, IR::Instr *callInstr,
    IR::Instr *insertInstr, IR::LabelInstr *labelHelper, IR::LabelInstr *doneLabel)
{
    //  if regSrcStr is not object, JMP $helper
    //  CMP [regSrcStr + offset(type)] , static string type   -- check base string type
    //  JNE $helper
    //  MOV r1, [regSrcStr + offset(m_pszValue)]
    //  TEST r1, r1
    //  JEQ $helper
    //  MOV r2, srcIndex
    //  If r2 is not int, JMP $helper
    //  Convert r2 to int
    //  CMP [regSrcStr + offsetof(length)], r2
    //  JBE $helper
    //  MOVZX r2, [r1 + r2 * 2]
    //  if (charAt)
    //      PUSH r1
    //      PUSH scriptContext
    //      CALL GetStringFromChar
    //      MOV dst, EAX
    //  else (charCodeAt)
    //      if (codePointAt)
    //          Lowerer.GenerateFastCodePointAt -- Common inline functions
    //      Convert r2 to Var
    //      MOV dst, r2
    bool isInt = false;
    bool isNotTaggedValue = false;

    if (srcStr->IsRegOpnd())
    {
        if (srcStr->AsRegOpnd()->IsTaggedInt())
        {
            isInt = true;

        }
        else if (srcStr->AsRegOpnd()->IsNotTaggedValue())
        {
            isNotTaggedValue = true;
        }
    }

    IR::RegOpnd *regSrcStr = GetRegOpnd(srcStr, insertInstr, m_func, TyVar);

    if (!isNotTaggedValue)
    {
        if (!isInt)
        {
            m_lowererMD.GenerateObjectTest(regSrcStr, insertInstr, labelHelper);
        }
        else
        {
            // Insert delete branch opcode to tell the dbChecks not to assert on this helper label
            IR::Instr *fakeBr = IR::PragmaInstr::New(Js::OpCode::DeletedNonHelperBranch, 0, this->m_func);
            insertInstr->InsertBefore(fakeBr);

            InsertBranch(Js::OpCode::Br, labelHelper, insertInstr);
        }
    }

    // Bail out if index a constant and is less than zero.
    if (srcIndex->IsAddrOpnd() && Js::TaggedInt::ToInt32(srcIndex->AsAddrOpnd()->m_address) < 0)
    {
        labelHelper->isOpHelper = false;
        InsertBranch(Js::OpCode::Br, labelHelper, insertInstr);
        return false;
    }

    GenerateStringTest(regSrcStr, insertInstr, labelHelper, nullptr, false);

    // r1 contains the value of the char16* pointer inside JavascriptString.
    // MOV r1, [regSrcStr + offset(m_pszValue)]
    IR::RegOpnd *r1 = IR::RegOpnd::New(TyMachReg, this->m_func);
    IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(regSrcStr->AsRegOpnd(), Js::JavascriptString::GetOffsetOfpszValue(), TyMachPtr, this->m_func);
    InsertMove(r1, indirOpnd, insertInstr);

    // TEST r1, r1 -- Null pointer test
    // JEQ $helper
    InsertTestBranch(r1, r1, Js::OpCode::BrEq_A, labelHelper, insertInstr);

    IR::RegOpnd *strLength = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(strLength, IR::IndirOpnd::New(regSrcStr, offsetof(Js::JavascriptString, m_charLength), TyUint32, this->m_func), insertInstr);
    IR::Opnd* indexOpnd = nullptr;
    if (srcIndex->IsAddrOpnd())
    {
        uint32 indexValue = Js::TaggedInt::ToUInt32(srcIndex->AsAddrOpnd()->m_address);
        // CMP [regSrcStr + offsetof(length)], index
        // Use unsigned compare, this should handle negative indexes as well (they become > INT_MAX)
        // JBE $helper
        InsertCompareBranch(strLength, IR::IntConstOpnd::New(indexValue, TyUint32, m_func), Js::OpCode::BrLe_A, true, labelHelper, insertInstr);

        // Mask off the sign so that poisoning will work for negative indices
#if TARGET_32
        uint32 maskedIndex = CONFIG_FLAG_RELEASE(PoisonStringLoad) ? (indexValue & INT32_MAX) : indexValue;
#else
        uint32 maskedIndex = indexValue;
#endif
        indirOpnd = IR::IndirOpnd::New(r1, maskedIndex * sizeof(char16), TyUint16, this->m_func);
        indexOpnd = IR::IntConstOpnd::New(maskedIndex, TyMachPtr, m_func);
    }
    else
    {
        IR::RegOpnd *r2 = IR::RegOpnd::New(TyVar, this->m_func);
        // MOV r2, srcIndex
        InsertMove(r2, srcIndex, insertInstr);

        r2 = GenerateUntagVar(r2, labelHelper, insertInstr);

        // CMP [regSrcStr + offsetof(length)], r2
        // Use unsigned compare, this should handle negative indexes as well (they become > INT_MAX)
        // JBE $helper
        InsertCompareBranch(strLength, r2, Js::OpCode::BrLe_A, true, labelHelper, insertInstr);

#if TARGET_32
        if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
        {
            // Mask off the sign so that poisoning will work for negative indices
            InsertAnd(r2, r2, IR::IntConstOpnd::New(INT32_MAX, TyInt32, m_func), insertInstr);
        }
#endif

        if (r2->GetSize() != MachPtr)
        {
            r2 = r2->UseWithNewType(TyMachPtr, this->m_func)->AsRegOpnd();
        }
        indexOpnd = r2;

        indirOpnd = IR::IndirOpnd::New(r1, r2, 1, TyUint16, this->m_func);
    }
    IR::RegOpnd* maskOpnd = nullptr;
    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        maskOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
        if (strLength->GetSize() != MachPtr)
        {
            strLength = strLength->UseWithNewType(TyMachPtr, this->m_func)->AsRegOpnd();
        }
        InsertSub(false, maskOpnd, indexOpnd, strLength, insertInstr);
        InsertShift(Js::OpCode::Shr_A, false, maskOpnd, maskOpnd, IR::IntConstOpnd::New(MachRegInt * 8 - 1, TyInt8, m_func), insertInstr);

        if (maskOpnd->GetSize() != TyUint32)
        {
            maskOpnd = maskOpnd->UseWithNewType(TyUint32, this->m_func)->AsRegOpnd();
        }
    }
    // MOVZX charReg, [r1 + r2 * 2]  -- this is the value of the char
    IR::RegOpnd *charReg = IR::RegOpnd::New(TyUint32, this->m_func);
    InsertMove(charReg, indirOpnd, insertInstr);
    if (CONFIG_FLAG_RELEASE(PoisonStringLoad))
    {
        InsertAnd(charReg, charReg, maskOpnd, insertInstr);
    }
    if (index == Js::BuiltinFunction::JavascriptString_CharAt)
    {
        IR::Opnd *resultOpnd;
        if (dst->IsEqual(srcStr))
        {
            resultOpnd = IR::RegOpnd::New(TyVar, this->m_func);
        }
        else
        {
            resultOpnd = dst;
        }
        GenerateGetSingleCharString(charReg, resultOpnd, labelHelper, doneLabel, insertInstr, false);
    }
    else
    {
        Assert(index == Js::BuiltinFunction::JavascriptString_CharCodeAt || index == Js::BuiltinFunction::JavascriptString_CodePointAt);

        if (index == Js::BuiltinFunction::JavascriptString_CodePointAt)
        {
            GenerateFastInlineStringCodePointAt(insertInstr, this->m_func, strLength, srcIndex, charReg, r1);
        }

        if (charReg->GetSize() != MachPtr)
        {
            charReg = charReg->UseWithNewType(TyMachPtr, this->m_func)->AsRegOpnd();
        }
        m_lowererMD.GenerateInt32ToVarConversion(charReg, insertInstr);

        // MOV dst, charReg
        InsertMove(dst, charReg, insertInstr);
    }
    return true;
}